

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectRestraint.cpp
# Opt level: O0

void __thiscall OpenMD::ObjectRestraint::calcForce(ObjectRestraint *this,Vector3d *struc)

{
  mapped_type *pmVar1;
  double *pdVar2;
  Vector<double,_3U> *in_RSI;
  Vector3<double> *in_RDI;
  double dVar3;
  RealType p_1;
  Vector3d frc_1;
  RealType r_1;
  RealType p;
  Vector3d frc;
  RealType r;
  Vector3d del;
  Vector<double,_3U> *in_stack_fffffffffffffed8;
  Vector<double,_3U> *in_stack_fffffffffffffee0;
  pair<double,_double> local_100;
  key_type *in_stack_ffffffffffffff18;
  map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  *in_stack_ffffffffffffff20;
  pair<double,_double> local_a8 [2];
  double local_80;
  double local_48;
  
  in_RDI[2].super_Vector<double,_3U>.data_[1] = 0.0;
  Vector3<double>::operator=
            ((Vector3<double> *)in_stack_fffffffffffffee0,
             (Vector3<double> *)in_stack_fffffffffffffed8);
  if (((ulong)in_RDI[4].super_Vector<double,_3U>.data_[0] & 0x100000000) != 0) {
    OpenMD::operator-(in_RSI,in_stack_fffffffffffffee0);
    Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8)
    ;
    local_48 = Vector<double,_3U>::length((Vector<double,_3U> *)0x3c2f18);
    OpenMD::operator*((double)in_RSI,in_stack_fffffffffffffee0);
    Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8)
    ;
    in_stack_fffffffffffffee0 =
         (Vector<double,_3U> *)((in_RDI->super_Vector<double,_3U>).data_[2] * 0.5);
    local_80 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x3c2f91);
    local_80 = (double)in_stack_fffffffffffffee0 * local_80;
    in_RDI[2].super_Vector<double,_3U>.data_[1] =
         local_80 + in_RDI[2].super_Vector<double,_3U>.data_[1];
    OpenMD::operator*(in_RSI,(double)in_stack_fffffffffffffee0);
    Vector<double,_3U>::operator+=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    if (((ulong)in_RDI[4].super_Vector<double,_3U>.data_[0] & 1) != 0) {
      local_a8[0] = std::make_pair<double&,double&>
                              (in_stack_fffffffffffffee0->data_,in_stack_fffffffffffffed8->data_);
      pmVar1 = std::
               map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
               ::operator[](in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      std::pair<double,_double>::operator=(pmVar1,local_a8);
    }
  }
  if (((ulong)in_RDI[4].super_Vector<double,_3U>.data_[0] & 0x200000000) != 0) {
    pdVar2 = Vector<double,_3U>::operator()(in_RSI,2);
    dVar3 = *pdVar2 - in_RDI[3].super_Vector<double,_3U>.data_[2];
    Vector3<double>::Vector3
              (in_RDI,(double)in_RSI,(double)in_stack_fffffffffffffee0,
               (double)in_stack_fffffffffffffed8);
    in_RDI[2].super_Vector<double,_3U>.data_[1] =
         in_RDI[1].super_Vector<double,_3U>.data_[0] * 0.5 * dVar3 * dVar3 +
         in_RDI[2].super_Vector<double,_3U>.data_[1];
    OpenMD::operator*(in_RSI,(double)in_stack_fffffffffffffee0);
    Vector<double,_3U>::operator+=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    if (((ulong)in_RDI[4].super_Vector<double,_3U>.data_[0] & 1) != 0) {
      local_100 = std::make_pair<double&,double&>
                            (in_stack_fffffffffffffee0->data_,in_stack_fffffffffffffed8->data_);
      pmVar1 = std::
               map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
               ::operator[](in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      std::pair<double,_double>::operator=(pmVar1,&local_100);
    }
  }
  return;
}

Assistant:

void ObjectRestraint::calcForce(Vector3d struc) {
    pot_   = 0.0;
    force_ = V3Zero;

    if (restType_ & rtDisplacement) {
      Vector3d del = struc - refPos_;
      RealType r   = del.length();
      Vector3d frc = -kDisp_ * del;
      RealType p   = 0.5 * kDisp_ * del.lengthSquare();

      pot_ += p;
      force_ += frc * scaleFactor_;
      if (printRest_) restInfo_[rtDisplacement] = std::make_pair(r, p);
    }

    if (restType_ & rtAbsoluteZ) {
      RealType r   = struc(2) - posZ0_;
      Vector3d frc = Vector3d(0.0, 0.0, -kAbs_ * r);
      RealType p   = 0.5 * kAbs_ * r * r;

      pot_ += p;
      force_ += frc * scaleFactor_;
      if (printRest_) restInfo_[rtAbsoluteZ] = std::make_pair(r, p);
    }
  }